

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O1

void __thiscall CLParserTestShowIncludes::~CLParserTestShowIncludes(CLParserTestShowIncludes *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CLParserTest, ShowIncludes) {
  ASSERT_EQ("", CLParser::FilterShowIncludes("", ""));

  ASSERT_EQ("", CLParser::FilterShowIncludes("Sample compiler output", ""));
  ASSERT_EQ("c:\\Some Files\\foobar.h",
            CLParser::FilterShowIncludes("Note: including file: "
                                         "c:\\Some Files\\foobar.h", ""));
  ASSERT_EQ("c:\\initspaces.h",
            CLParser::FilterShowIncludes("Note: including file:    "
                                         "c:\\initspaces.h", ""));
  ASSERT_EQ("c:\\initspaces.h",
            CLParser::FilterShowIncludes("Non-default prefix: inc file:    "
                                         "c:\\initspaces.h",
                    "Non-default prefix: inc file:"));
}